

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_layout.h
# Opt level: O2

void __thiscall
agge::tests::ref_glyph_run::ref_glyph_run<7ul>
          (ref_glyph_run *this,shared_ptr<agge::font> *font_,real_t offset_x,real_t offset_y,
          positioned_glyph (*positioned) [7])

{
  vector_r vVar1;
  positioned_glyph *in_RCX;
  
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> *)this,
             &font_->super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  vVar1.dy = offset_y;
  vVar1.dx = offset_x;
  this->_offset = vVar1;
  mkvector<agge::positioned_glyph*>(&this->_glyphs,(tests *)positioned,positioned[1],in_RCX);
  this->_check_glyph_advances = true;
  return;
}

Assistant:

inline ref_glyph_run::ref_glyph_run(shared_ptr<font> font_, real_t offset_x, real_t offset_y,
				positioned_glyph (&positioned)[n])
			: _font(font_), _offset(create_vector(offset_x, offset_y)), _glyphs(mkvector(begin(positioned),
				end(positioned))), _check_glyph_advances(true)
		{	}